

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O0

uint64_t aom_sum_squares_2d_i16_nxn_avx2(int16_t *src,int stride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int in_ECX;
  longlong in_RDX;
  longlong in_RSI;
  long in_RDI;
  undefined1 auVar7 [32];
  __m128i v;
  __m128i result_64_2_int;
  __m128i higher_64_2_Value;
  __m128i lower_64_2_Value;
  __m256i v_sum_0123_d;
  __m256i v_sum_23_d;
  __m256i v_sum_01_d;
  __m256i v_sq_3_d;
  __m256i v_sq_2_d;
  __m256i v_sq_1_d;
  __m256i v_sq_0_d;
  __m256i v_val_3_w;
  __m256i v_val_2_w;
  __m256i v_val_1_w;
  __m256i v_val_0_w;
  int16_t *tempsrc;
  int row;
  __m256i v_acc_d;
  int col;
  __m256i v_zext_mask_q;
  __m256i v_acc_q;
  uint64_t result;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  int local_524;
  undefined1 local_520 [32];
  int local_4e4;
  undefined1 local_4c0 [24];
  undefined8 uStack_4a8;
  uint64_t local_4a0 [2];
  int local_490;
  int local_48c;
  long local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 (*local_440) [32];
  undefined1 (*local_438) [32];
  undefined1 (*local_430) [32];
  undefined1 (*local_428) [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_208;
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [16];
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_48c = (int)in_RSI;
  local_490 = (int)in_RDX;
  local_460 = 0;
  uStack_458 = 0;
  uStack_450 = 0;
  uStack_448 = 0;
  _local_4c0 = ZEXT1632(ZEXT816(0));
  local_208 = 0xffffffff;
  local_38 = 0xffffffff;
  local_40 = 0xffffffff;
  local_48 = 0xffffffff;
  local_50 = 0xffffffff;
  auVar1 = vpunpcklqdq_avx(ZEXT816(0xffffffff),ZEXT816(0xffffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0xffffffff),ZEXT816(0xffffffff));
  auVar7._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar7._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_80._16_8_ = auVar7._16_8_;
  local_80._24_8_ = auVar7._24_8_;
  local_4e4 = 0;
  local_488 = in_RDI;
  while( true ) {
    auVar1 = stack0xfffffffffffffb50;
    if (in_ECX <= local_4e4) break;
    local_480 = 0;
    uStack_478 = 0;
    uStack_470 = 0;
    uStack_468 = 0;
    local_520 = ZEXT1632(ZEXT816(0));
    local_524 = 0;
    while( true ) {
      if (local_490 <= local_524) break;
      local_428 = (undefined1 (*) [32])(local_488 + (long)local_524 * 2);
      local_360 = *(undefined8 *)*local_428;
      uStack_358 = *(undefined8 *)(*local_428 + 8);
      uStack_350 = *(undefined8 *)(*local_428 + 0x10);
      uStack_348 = *(undefined8 *)(*local_428 + 0x18);
      local_430 = (undefined1 (*) [32])(*local_428 + (long)local_48c * 2);
      local_3a0 = *(undefined8 *)*local_430;
      uStack_398 = *(undefined8 *)(*local_430 + 8);
      uStack_390 = *(undefined8 *)(*local_430 + 0x10);
      uStack_388 = *(undefined8 *)(*local_430 + 0x18);
      local_438 = (undefined1 (*) [32])(*local_428 + (long)(local_48c << 1) * 2);
      local_3e0 = *(undefined8 *)*local_438;
      uStack_3d8 = *(undefined8 *)(*local_438 + 8);
      uStack_3d0 = *(undefined8 *)(*local_438 + 0x10);
      uStack_3c8 = *(undefined8 *)(*local_438 + 0x18);
      local_440 = (undefined1 (*) [32])(*local_428 + (long)(local_48c * 3) * 2);
      local_420 = *(undefined8 *)*local_440;
      uStack_418 = *(undefined8 *)(*local_440 + 8);
      uStack_410 = *(undefined8 *)(*local_440 + 0x10);
      uStack_408 = *(undefined8 *)(*local_440 + 0x18);
      auVar3 = vpmaddwd_avx2(*local_428,*local_428);
      auVar4 = vpmaddwd_avx2(*local_430,*local_430);
      auVar5 = vpmaddwd_avx2(*local_438,*local_438);
      auVar6 = vpmaddwd_avx2(*local_440,*local_440);
      local_5e0 = auVar3._0_8_;
      local_240 = local_5e0;
      uStack_5d8 = auVar3._8_8_;
      uStack_238 = uStack_5d8;
      uStack_5d0 = auVar3._16_8_;
      uStack_230 = uStack_5d0;
      uStack_5c8 = auVar3._24_8_;
      uStack_228 = uStack_5c8;
      local_600 = auVar4._0_8_;
      local_260 = local_600;
      uStack_5f8 = auVar4._8_8_;
      uStack_258 = uStack_5f8;
      uStack_5f0 = auVar4._16_8_;
      uStack_250 = uStack_5f0;
      uStack_5e8 = auVar4._24_8_;
      uStack_248 = uStack_5e8;
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      local_620 = auVar5._0_8_;
      local_280 = local_620;
      uStack_618 = auVar5._8_8_;
      uStack_278 = uStack_618;
      uStack_610 = auVar5._16_8_;
      uStack_270 = uStack_610;
      uStack_608 = auVar5._24_8_;
      uStack_268 = uStack_608;
      local_640 = auVar6._0_8_;
      local_2a0 = local_640;
      uStack_638 = auVar6._8_8_;
      uStack_298 = uStack_638;
      uStack_630 = auVar6._16_8_;
      uStack_290 = uStack_630;
      uStack_628 = auVar6._24_8_;
      uStack_288 = uStack_628;
      auVar4 = vpaddd_avx2(auVar5,auVar6);
      local_660 = auVar3._0_8_;
      local_2c0 = local_660;
      uStack_658 = auVar3._8_8_;
      uStack_2b8 = uStack_658;
      uStack_650 = auVar3._16_8_;
      uStack_2b0 = uStack_650;
      uStack_648 = auVar3._24_8_;
      uStack_2a8 = uStack_648;
      local_680 = auVar4._0_8_;
      local_2e0 = local_680;
      uStack_678 = auVar4._8_8_;
      uStack_2d8 = uStack_678;
      uStack_670 = auVar4._16_8_;
      uStack_2d0 = uStack_670;
      uStack_668 = auVar4._24_8_;
      uStack_2c8 = uStack_668;
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      local_300 = local_520._0_8_;
      uStack_2f8 = local_520._8_8_;
      uStack_2f0 = local_520._16_8_;
      uStack_2e8 = local_520._24_8_;
      local_6a0 = auVar3._0_8_;
      local_320 = local_6a0;
      uStack_698 = auVar3._8_8_;
      uStack_318 = uStack_698;
      uStack_690 = auVar3._16_8_;
      uStack_310 = uStack_690;
      uStack_688 = auVar3._24_8_;
      uStack_308 = uStack_688;
      local_520 = vpaddd_avx2(local_520,auVar3);
      local_524 = local_524 + 0x10;
      local_400 = local_420;
      uStack_3f8 = uStack_418;
      uStack_3f0 = uStack_410;
      uStack_3e8 = uStack_408;
      local_3c0 = local_3e0;
      uStack_3b8 = uStack_3d8;
      uStack_3b0 = uStack_3d0;
      uStack_3a8 = uStack_3c8;
      local_380 = local_3a0;
      uStack_378 = uStack_398;
      uStack_370 = uStack_390;
      uStack_368 = uStack_388;
      local_340 = local_360;
      uStack_338 = uStack_358;
      uStack_330 = uStack_350;
      uStack_328 = uStack_348;
    }
    local_1a0 = local_4c0._0_8_;
    uStack_198 = local_4c0._8_8_;
    uStack_190 = local_4c0._16_8_;
    uStack_188 = uStack_4a8;
    local_160 = local_520._0_8_;
    uStack_158 = local_520._8_8_;
    uStack_150 = local_520._16_8_;
    uStack_148 = local_520._24_8_;
    uStack_170 = local_80._16_8_;
    uStack_168 = local_80._24_8_;
    auVar3._16_8_ = local_80._16_8_;
    auVar3._0_16_ = auVar7._0_16_;
    auVar3._24_8_ = local_80._24_8_;
    local_1c0 = vpand_avx2(local_520,auVar3);
    auVar3 = vpaddq_avx2(_local_4c0,local_1c0);
    local_4c0._0_8_ = auVar3._0_8_;
    local_1e0 = local_4c0._0_8_;
    local_4c0._8_8_ = auVar3._8_8_;
    uStack_1d8 = local_4c0._8_8_;
    local_4c0._16_8_ = auVar3._16_8_;
    uStack_1d0 = local_4c0._16_8_;
    uStack_4a8 = auVar3._24_8_;
    uStack_1c8 = uStack_4a8;
    local_120 = local_520._0_8_;
    uStack_118 = local_520._8_8_;
    uStack_110 = local_520._16_8_;
    uStack_108 = local_520._24_8_;
    local_124 = 0x20;
    local_200 = vpsrlq_avx2(local_520,ZEXT416(0x20));
    _local_4c0 = vpaddq_avx2(auVar3,local_200);
    local_488 = local_488 + (long)(local_48c << 2) * 2;
    local_4e4 = local_4e4 + 4;
    local_180 = auVar7._0_16_;
  }
  local_100 = local_4c0._0_8_;
  uStack_f8 = local_4c0._8_8_;
  uStack_f0 = local_4c0._16_8_;
  uStack_e8 = uStack_4a8;
  uStack_a8 = uStack_4a8;
  local_b0 = local_4c0._16_8_;
  auVar2._8_8_ = uStack_6b8;
  auVar2._0_8_ = local_6c0;
  auVar1 = vpaddq_avx(auVar1,auVar2);
  local_6d0 = auVar1._0_8_;
  uStack_6c8 = auVar1._8_8_;
  local_90 = local_6d0;
  uStack_88 = uStack_6c8;
  local_a0 = local_6d0;
  uStack_98 = uStack_6c8;
  local_e0 = vpunpckhqdq_avx(auVar1,auVar1);
  local_d0 = local_6d0;
  uStack_c8 = uStack_6c8;
  vpaddq_avx(auVar1,local_e0);
  v[1] = in_RDX;
  v[0] = in_RSI;
  local_80 = auVar7;
  xx_storel_64(local_4a0,v);
  return local_4a0[0];
}

Assistant:

static uint64_t aom_sum_squares_2d_i16_nxn_avx2(const int16_t *src, int stride,
                                                int width, int height) {
  uint64_t result;
  __m256i v_acc_q = _mm256_setzero_si256();
  const __m256i v_zext_mask_q = _mm256_set1_epi64x(~0u);
  for (int col = 0; col < height; col += 4) {
    __m256i v_acc_d = _mm256_setzero_si256();
    for (int row = 0; row < width; row += 16) {
      const int16_t *tempsrc = src + row;
      const __m256i v_val_0_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 0 * stride));
      const __m256i v_val_1_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 1 * stride));
      const __m256i v_val_2_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 2 * stride));
      const __m256i v_val_3_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 3 * stride));

      const __m256i v_sq_0_d = _mm256_madd_epi16(v_val_0_w, v_val_0_w);
      const __m256i v_sq_1_d = _mm256_madd_epi16(v_val_1_w, v_val_1_w);
      const __m256i v_sq_2_d = _mm256_madd_epi16(v_val_2_w, v_val_2_w);
      const __m256i v_sq_3_d = _mm256_madd_epi16(v_val_3_w, v_val_3_w);

      const __m256i v_sum_01_d = _mm256_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m256i v_sum_23_d = _mm256_add_epi32(v_sq_2_d, v_sq_3_d);
      const __m256i v_sum_0123_d = _mm256_add_epi32(v_sum_01_d, v_sum_23_d);

      v_acc_d = _mm256_add_epi32(v_acc_d, v_sum_0123_d);
    }
    v_acc_q =
        _mm256_add_epi64(v_acc_q, _mm256_and_si256(v_acc_d, v_zext_mask_q));
    v_acc_q = _mm256_add_epi64(v_acc_q, _mm256_srli_epi64(v_acc_d, 32));
    src += 4 * stride;
  }
  __m128i lower_64_2_Value = _mm256_castsi256_si128(v_acc_q);
  __m128i higher_64_2_Value = _mm256_extracti128_si256(v_acc_q, 1);
  __m128i result_64_2_int = _mm_add_epi64(lower_64_2_Value, higher_64_2_Value);

  result_64_2_int = _mm_add_epi64(
      result_64_2_int, _mm_unpackhi_epi64(result_64_2_int, result_64_2_int));

  xx_storel_64(&result, result_64_2_int);

  return result;
}